

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
::Item(SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *this,uint *key,FunctionBody **value)

{
  CCLock *this_00;
  int iVar1;
  
  this_00 = &this->syncObj->super_CCLock;
  CCLock::Enter(this_00);
  iVar1 = BaseDictionary<unsigned_int,Js::FunctionBody*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,Js::FunctionBody*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<unsigned_int,Js::FunctionBody*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this,key,value);
  CCLock::Leave(this_00);
  return iVar1;
}

Assistant:

int Item(const TKey& key, const TValue& value)
        {
            typename LockPolicy::AddRemoveLock autoLock(syncObj);

            return __super::Item(key, value);
        }